

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_cor_qt.cpp
# Opt level: O0

void __thiscall sc_core::sc_cor_qt::stack_protect(sc_cor_qt *this,bool enable)

{
  int iVar1;
  void *__addr;
  byte in_SIL;
  char *in_RDI;
  int ret;
  caddr_t redzone;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (stack_protect::pagesize == 0) {
    stack_protect::pagesize = sysconf(0x1e);
  }
  if (stack_protect::pagesize == 0) {
    sc_assertion_failed((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI
                        ,0);
  }
  if (*(ulong *)(in_RDI + 8) <= stack_protect::pagesize * 2) {
    sc_assertion_failed((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI
                        ,0);
  }
  __addr = (void *)((((*(long *)(in_RDI + 0x10) + stack_protect::pagesize) - 1) /
                    stack_protect::pagesize) * stack_protect::pagesize);
  if ((in_SIL & 1) == 0) {
    iVar1 = mprotect(__addr,stack_protect::pagesize - 1,3);
  }
  else {
    iVar1 = mprotect(__addr,stack_protect::pagesize - 1,0);
  }
  if (iVar1 == 0) {
    return;
  }
  sc_assertion_failed((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI,0);
}

Assistant:

void
sc_cor_qt::stack_protect( bool enable )
{
    // Code needs to be tested on HP-UX and disabled if it doesn't work there
    // Code still needs to be ported to WIN32

    static std::size_t pagesize;

    if( pagesize == 0 ) {
#       if defined(__ppc__)
	    pagesize = getpagesize();
#       else
	    pagesize = sysconf( _SC_PAGESIZE );
#       endif
    }

    sc_assert( pagesize != 0 );
    sc_assert( m_stack_size > ( 2 * pagesize ) );

#ifdef QUICKTHREADS_GROW_DOWN
    // Stacks grow from high address down to low address
    caddr_t redzone = caddr_t( ( ( std::size_t( m_stack ) + pagesize - 1 ) /
				 pagesize ) * pagesize );
#else
    // Stacks grow from low address up to high address
    caddr_t redzone = caddr_t( ( ( std::size_t( m_stack ) +
				   m_stack_size - pagesize ) /
				 pagesize ) * pagesize );
#endif

    int ret;

    // Enable the red zone at the end of the stack so that references within
    // it will cause an interrupt.

    if( enable ) {
        ret = mprotect( redzone, pagesize - 1, PROT_NONE );
    }

    // Revert the red zone to normal memory usage.

    else {
        ret = mprotect( redzone, pagesize - 1, PROT_READ | PROT_WRITE );
    }

    sc_assert( ret == 0 );
}